

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

bool __thiscall
UnscentedKalmanFilter::GenerateAugmentedSigmaPoints
          (UnscentedKalmanFilter *this,VectorXd *x,MatrixXd *P,MatrixXd *Xsig_aug)

{
  double dVar1;
  ComputationInfo CVar2;
  Index IVar3;
  Scalar *pSVar4;
  Scalar *pSVar5;
  ostream *poVar6;
  DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *m;
  range_error *this_00;
  int iVar7;
  long lVar8;
  ColXpr local_3b0;
  ColXpr local_388;
  ScalarMultipleReturnType local_360;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_330;
  ColXpr local_2f0;
  ColXpr local_2c8;
  ScalarMultipleReturnType local_2a0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_270;
  int local_22c;
  int local_228;
  int k;
  int j;
  int i_1;
  double s;
  MatrixTypeNested local_1f0;
  undefined1 local_1e8 [8];
  MatrixXd L;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> es;
  LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> lltOfPaug;
  Scalar local_a0;
  int local_94;
  undefined1 local_90 [4];
  int i;
  undefined1 local_58 [8];
  MatrixXd P_aug;
  VectorXd x_aug;
  int n_x;
  bool ret;
  MatrixXd *Xsig_aug_local;
  MatrixXd *P_local;
  VectorXd *x_local;
  UnscentedKalmanFilter *this_local;
  
  IVar3 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::rows
                    (&x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>);
  iVar7 = (int)IVar3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,(long)this->n_aug_);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_58,&this->n_aug_,&this->n_aug_);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head
            ((SegmentReturnType *)local_90,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,(long)iVar7);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)local_90,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
  for (local_94 = iVar7; local_94 < this->n_aug_; local_94 = local_94 + 1) {
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                         m_storage.m_cols,(long)local_94);
    *pSVar4 = 0.0;
  }
  local_a0 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::fill
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_58,&local_a0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::topLeftCorner
            ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)
             &lltOfPaug.m_isInitialized,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_58,(long)iVar7,
             (long)iVar7);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false> *)&lltOfPaug.m_isInitialized,
             (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)P);
  dVar1 = this->std_a_;
  lVar8 = (long)(this->n_aug_ + -2);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_58,lVar8
                      ,lVar8);
  *pSVar5 = dVar1 * dVar1;
  dVar1 = this->std_yawdd_;
  lVar8 = (long)(this->n_aug_ + -1);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_58,lVar8
                      ,lVar8);
  *pSVar5 = dVar1 * dVar1;
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::LLT
            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
             &es.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(MatrixType *)local_58);
  CVar2 = Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::info
                    ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                     &es.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows);
  if (CVar2 == NumericalIssue) {
    if (this->debug_ != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"LLT failed!");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver
                ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 &L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols,(MatrixType *)local_58,true);
      poVar6 = std::operator<<((ostream *)&std::cout,"P_aug:");
      poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                        local_58);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<((ostream *)&std::cout,"Eigenvalues of P_aug:");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      m = (DenseBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_> *)
          Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvalues
                    ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     &L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_cols);
      poVar6 = Eigen::operator<<(poVar6,m);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~EigenSolver
                ((EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                 &L.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                  m_cols);
    }
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"LLT failed");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  local_1f0 = (MatrixTypeNested)
              Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::matrixL
                        ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                         &es.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::
  Matrix<Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1u>>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_1e8,
             (EigenBase<Eigen::TriangularView<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U>_>
              *)&local_1f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
            ((ColXpr *)&s,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig_aug,0);
  Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&s,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  _j = sqrt(this->lambda_ + (double)this->n_aug_);
  for (k = 0; k < this->n_aug_; k = k + 1) {
    local_228 = k + 1;
    local_22c = local_228 + this->n_aug_;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_2c8,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1e8,(long)k)
    ;
    Eigen::operator*(&local_2a0,(Scalar *)&j,(StorageBaseType *)&local_2c8);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              (&local_270,
               (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
               &P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,(MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                        *)&local_2a0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_2f0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig_aug,
               (long)local_228);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_2f0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                *)&local_270);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_388,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1e8,(long)k)
    ;
    Eigen::operator*(&local_360,(Scalar *)&j,(StorageBaseType *)&local_388);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              (&local_330,
               (MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)
               &P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                m_cols,(MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                        *)&local_360);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_3b0,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)Xsig_aug,
               (long)local_22c);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true> *)&local_3b0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>_>
                *)&local_330);
  }
  if (2 < this->debug_) {
    poVar6 = std::operator<<((ostream *)&std::cout,"L:\n");
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      local_1e8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<((ostream *)&std::cout,"Xsig_aug:\n");
    poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                      Xsig_aug);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_1e8);
  Eigen::LLT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::~LLT
            ((LLT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
             &es.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_58);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &P_aug.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  return true;
}

Assistant:

bool UnscentedKalmanFilter::GenerateAugmentedSigmaPoints(const VectorXd &x, const MatrixXd &P, MatrixXd &Xsig_aug) const {

    bool ret = true;
    int n_x = x.rows();
    
    // create augmented mean vector
    VectorXd x_aug(n_aug_);
  
    // create augmented state covariance
    MatrixXd P_aug(n_aug_, n_aug_);

    // create augmented mean state
    x_aug.head(n_x) = x;
    for (int i=n_x; i<n_aug_; i++)
	    x_aug(i) = 0.0;

    // create augmented covariance matrix
    P_aug.fill(0.0);
    P_aug.topLeftCorner(n_x,n_x) = P;
    P_aug(n_aug_-2,n_aug_-2) = std_a_*std_a_;
    P_aug(n_aug_-1,n_aug_-1) = std_yawdd_*std_yawdd_;
 
    // Take matrix square root
    // 1. compute the Cholesky decomposition of P_aug
    Eigen::LLT<MatrixXd> lltOfPaug(P_aug); 
    if (lltOfPaug.info() == Eigen::NumericalIssue) {
	// if decomposition fails, we have numerical issues
        if (debug_) {
	    std::cout << "LLT failed!" << std::endl;
	    Eigen::EigenSolver<MatrixXd> es(P_aug);
	    cout << "P_aug:" << P_aug << endl;
	    cout << "Eigenvalues of P_aug:" << endl << es.eigenvalues() << endl;
	}
	throw std::range_error("LLT failed");
    }
    // 2. get the lower triangle
    MatrixXd L = lltOfPaug.matrixL(); 

    Xsig_aug.col(0) = x_aug;
        
    double s = sqrt(lambda_+n_aug_);

    for (int i=0; i<n_aug_; i++) {
	int j = i+1;
	int k = j+n_aug_;
        Xsig_aug.col(j) = x_aug + s * L.col(i);
        Xsig_aug.col(k) = x_aug - s * L.col(i);
    }

    if (debug_ > 2) {
        std::cout << "L:\n" << L << std::endl;
        std::cout << "Xsig_aug:\n" << Xsig_aug << std::endl;
    }
    return ret;
}